

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.h
# Opt level: O1

void assert_dbl_array_near(double *exp,double *real,size_t n,double tol,char *caller,int line)

{
  size_t sVar1;
  char *fmt;
  double dVar2;
  double dVar3;
  
  if (n != 0) {
    sVar1 = 0;
    do {
      dVar3 = exp[sVar1];
      dVar2 = real[sVar1];
      if (NAN(dVar3)) {
        if (!NAN(dVar2)) {
          fmt = "%s:%d expected NAN, got %0.3e";
          goto LAB_0013a0e2;
        }
      }
      else if (NAN(dVar2)) {
        fmt = "%s:%d expected %0.3e, got NAN";
        dVar2 = dVar3;
        goto LAB_0013a0e2;
      }
      if (ABS(dVar3) == INFINITY) {
        if (ABS(dVar2) != INFINITY) {
          fmt = "%s:%d expected INFINITY, got %0.3e";
LAB_0013a0e2:
          unit_error(fmt,dVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/ELIFE-ASU[P]Inform/test/unittests/relative_entropy.c"
                     ,(ulong)caller & 0xffffffff);
        }
      }
      else if (ABS(dVar2) == INFINITY) {
        fmt = "%s:%d expected %0.3e, got INFINITY";
        dVar2 = dVar3;
        goto LAB_0013a0e2;
      }
      dVar3 = dVar3 - dVar2;
      dVar2 = -dVar3;
      if (-dVar3 <= dVar3) {
        dVar2 = dVar3;
      }
      if (1.0000000002220446e-06 < dVar2) {
        unit_error("%s:%d expected %0.3e, got %0.3e (diff %0.3e, tol %0.3e)",
                   "/workspace/llm4binary/github/license_c_cmakelists/ELIFE-ASU[P]Inform/test/unittests/relative_entropy.c"
                   ,(ulong)caller & 0xffffffff);
      }
      sVar1 = sVar1 + 1;
    } while (n != sVar1);
  }
  return;
}

Assistant:

inline static void assert_dbl_array_near(double *exp, double *real, size_t n, double tol, char const *caller, int line)
{
  for (size_t i = 0; i < n; ++i)
  {
    assert_dbl_near(exp[i], real[i], tol, caller, line);
  }
}